

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-emit.c
# Opt level: O0

void fy_emit_cleanup(fy_emitter *emit)

{
  fy_eventp *fyep_00;
  fy_eventp *fyep;
  fy_emitter *emit_local;
  
  if ((emit->fyd == (fy_document *)0x0) && (emit->fyds != (fy_document_state *)0x0)) {
    fy_document_state_unref(emit->fyds);
  }
  fy_emit_accum_cleanup(&emit->ea);
  while( true ) {
    fyep_00 = fy_eventp_list_pop(&emit->queued_events);
    if (fyep_00 == (fy_eventp *)0x0) break;
    fy_eventp_release(fyep_00);
  }
  if ((emit->state_stack != (fy_emitter_state *)0x0) &&
     (emit->state_stack != emit->state_stack_inplace)) {
    free(emit->state_stack);
  }
  if ((emit->sc_stack != (fy_emit_save_ctx *)0x0) && (emit->sc_stack != emit->sc_stack_inplace)) {
    free(emit->sc_stack);
  }
  fy_diag_unref(emit->diag);
  return;
}

Assistant:

void fy_emit_cleanup(struct fy_emitter *emit) {
    struct fy_eventp *fyep;

    if (!emit->fyd && emit->fyds)
        fy_document_state_unref(emit->fyds);

    fy_emit_accum_cleanup(&emit->ea);

    while ((fyep = fy_eventp_list_pop(&emit->queued_events)) != NULL)
        fy_eventp_release(fyep);

    if (emit->state_stack && emit->state_stack != emit->state_stack_inplace)
        free(emit->state_stack);

    if (emit->sc_stack && emit->sc_stack != emit->sc_stack_inplace)
        free(emit->sc_stack);

    fy_diag_unref(emit->diag);
}